

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

socket_t __thiscall
httplib::Server::create_server_socket
          (Server *this,string *host,int port,int socket_flags,SocketOptions *socket_options)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  socket_t sVar5;
  function<void_(int)> local_68;
  string local_48 [32];
  SocketOptions *local_28;
  SocketOptions *socket_options_local;
  int socket_flags_local;
  int port_local;
  string *host_local;
  Server *this_local;
  
  local_28 = socket_options;
  socket_options_local._0_4_ = socket_flags;
  socket_options_local._4_4_ = port;
  _socket_flags_local = host;
  host_local = (string *)this;
  std::__cxx11::string::string(local_48);
  iVar4 = socket_options_local._4_4_;
  iVar3 = (int)socket_options_local;
  iVar2 = this->address_family_;
  bVar1 = this->tcp_nodelay_;
  std::function<void_(int)>::function(&local_68,socket_options);
  sVar5 = detail::
          create_socket<httplib::Server::create_server_socket(std::__cxx11::string_const&,int,int,std::function<void(int)>)const::_lambda(int,addrinfo&)_1_>
                    (host,local_48,iVar4,iVar2,iVar3,bVar1 & 1,&local_68);
  std::function<void_(int)>::~function(&local_68);
  std::__cxx11::string::~string(local_48);
  return sVar5;
}

Assistant:

inline socket_t
Server::create_server_socket(const std::string &host, int port,
                             int socket_flags,
                             SocketOptions socket_options) const {
  return detail::create_socket(
      host, std::string(), port, address_family_, socket_flags, tcp_nodelay_,
      std::move(socket_options),
      [](socket_t sock, struct addrinfo &ai) -> bool {
        if (::bind(sock, ai.ai_addr, static_cast<socklen_t>(ai.ai_addrlen))) {
          return false;
        }
        if (::listen(sock, CPPHTTPLIB_LISTEN_BACKLOG)) { return false; }
        return true;
      });
}